

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O2

void __thiscall
Fifteen::drawNumberOnTile
          (Fifteen *this,QIcon *icon,QPixmap *pixmap,size_t fontSize,size_t number,
          NumberColor numberColor)

{
  QPainter painter;
  QArrayDataPointer<char16_t> local_60;
  undefined4 local_48;
  undefined2 local_44;
  short local_42;
  short local_40;
  short local_3e;
  undefined2 local_3c;
  undefined1 local_38 [16];
  
  QPainter::QPainter(&painter,(QPaintDevice *)pixmap);
  QString::QString((QString *)&local_60,"Times");
  QFont::QFont((QFont *)&local_48,(QString *)&local_60,(int)fontSize,700,false);
  QPainter::setFont((QFont *)&painter);
  QFont::~QFont((QFont *)&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  local_48 = 1;
  local_44 = 0xffff;
  local_42 = -(ushort)(numberColor == WHITE);
  local_3c = 0;
  local_40 = local_42;
  local_3e = local_42;
  QPainter::setPen((QColor *)&painter);
  local_38 = QPixmap::rect();
  QString::number((ulong)&local_60,(int)number + 1);
  QPainter::drawText((QRect *)&painter,(int)local_38,(QString *)0x84,(QRect *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QIcon::addPixmap(icon,pixmap,0,1);
  QPainter::end();
  QPainter::~QPainter(&painter);
  return;
}

Assistant:

void Fifteen::drawNumberOnTile( QIcon& icon, QPixmap& pixmap, size_t fontSize, size_t number, NumberColor numberColor )
{
    QPainter painter( &pixmap );
    painter.setFont( QFont( "Times", fontSize, QFont::Bold ));
    QColor color = numberColor == NumberColor::WHITE ? QColor( 255, 255, 255 ) : QColor( 0, 0, 0 );
    painter.setPen( color );
    painter.drawText( pixmap.rect(), Qt::AlignCenter, QString::number( number + 1 ));
    icon.addPixmap( pixmap );
    painter.end();
}